

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O1

void __thiscall
FIX::MessageCracker::crack
          (MessageCracker *this,Message *message,SessionID *sessionID,BeginString *beginString)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  string *psVar4;
  ApplVerID applVerID;
  undefined1 local_d0 [48];
  _Alloc_hider local_a0;
  size_type local_98;
  field_metrics local_80;
  FieldBase local_78;
  
  psVar4 = &(beginString->super_StringField).super_FieldBase.m_string;
  iVar2 = std::__cxx11::string::compare((char *)psVar4);
  if (iVar2 == 0) {
    FIX40::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
    return;
  }
  iVar2 = std::__cxx11::string::compare((char *)psVar4);
  if (iVar2 == 0) {
    FIX41::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
    return;
  }
  iVar2 = std::__cxx11::string::compare((char *)psVar4);
  if (iVar2 == 0) {
    FIX42::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
    return;
  }
  iVar2 = std::__cxx11::string::compare((char *)psVar4);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)psVar4);
    if (iVar2 == 0) {
      FIX44::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
      return;
    }
    iVar2 = std::__cxx11::string::compare((char *)psVar4);
    if (iVar2 == 0) {
      bVar1 = Message::isAdmin(message);
      if (bVar1) {
        FIXT11::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
        return;
      }
      StringField::StringField((StringField *)local_d0,0x468);
      local_d0._0_8_ = &PTR__FieldBase_0015b328;
      bVar1 = FieldMap::getFieldIfSet((FieldMap *)(message + 0x70),(FieldBase *)local_d0);
      if (!bVar1) {
        lVar3 = FIX::Session::lookupSession(sessionID);
        ApplVerID::ApplVerID((ApplVerID *)&local_78,(STRING *)(lVar3 + 0x200));
        local_d0._8_4_ = local_78.m_tag;
        std::__cxx11::string::_M_assign((string *)(local_d0 + 0x10));
        local_80 = local_78.m_metrics;
        local_98 = 0;
        *local_a0._M_p = '\0';
        FieldBase::~FieldBase(&local_78);
      }
      crack(this,message,sessionID,(ApplVerID *)local_d0);
      FieldBase::~FieldBase((FieldBase *)local_d0);
    }
    return;
  }
  FIX43::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  return;
}

Assistant:

void crack(const Message &message, const SessionID &sessionID, const BeginString &beginString) {
    if (beginString == BeginString_FIX40) {
      ((FIX40::MessageCracker &)(*this)).crack((const FIX40::Message &)message, sessionID);
    } else if (beginString == BeginString_FIX41) {
      ((FIX41::MessageCracker &)(*this)).crack((const FIX41::Message &)message, sessionID);
    } else if (beginString == BeginString_FIX42) {
      ((FIX42::MessageCracker &)(*this)).crack((const FIX42::Message &)message, sessionID);
    } else if (beginString == BeginString_FIX43) {
      ((FIX43::MessageCracker &)(*this)).crack((const FIX43::Message &)message, sessionID);
    } else if (beginString == BeginString_FIX44) {
      ((FIX44::MessageCracker &)(*this)).crack((const FIX44::Message &)message, sessionID);
    } else if (beginString == BeginString_FIXT11) {
      if (message.isAdmin()) {
        ((FIXT11::MessageCracker &)(*this)).crack((const FIXT11::Message &)message, sessionID);
      } else {
        ApplVerID applVerID;
        if (!message.getHeader().getFieldIfSet(applVerID)) {
          Session *pSession = Session::lookupSession(sessionID);
          applVerID = pSession->getSenderDefaultApplVerID();
        }

        crack(message, sessionID, applVerID);
      }
    }
  }